

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_mark.cpp
# Opt level: O2

void duckdb::NestedLoopJoinMark::Perform
               (DataChunk *left,ColumnDataCollection *right,bool *found_match,
               vector<duckdb::JoinCondition,_true> *conditions)

{
  idx_t lcount;
  idx_t rcount;
  bool bVar1;
  reference left_00;
  reference right_00;
  const_reference pvVar2;
  idx_t i;
  ulong __n;
  DataChunk scan_chunk;
  ColumnDataScanState scan_state;
  
  scan_state.current_chunk_state.handles._M_h._M_buckets =
       &scan_state.current_chunk_state.handles._M_h._M_single_bucket;
  scan_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  scan_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scan_state.current_chunk_state.handles._M_h._M_element_count = 0;
  scan_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  scan_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  scan_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  scan_state.current_chunk_state.properties = INVALID;
  scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ColumnDataCollection::InitializeScan(right,&scan_state,ALLOW_ZERO_COPY);
  DataChunk::DataChunk(&scan_chunk);
  ColumnDataCollection::InitializeScanChunk(right,&scan_chunk);
  while( true ) {
    bVar1 = ColumnDataCollection::Scan(right,&scan_state,&scan_chunk);
    if (!bVar1) break;
    for (__n = 0; __n < (ulong)(((long)(conditions->
                                       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       ).
                                       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(conditions->
                                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                      ).
                                      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        __n = __n + 1) {
      left_00 = vector<duckdb::Vector,_true>::get<true>(&left->data,__n);
      right_00 = vector<duckdb::Vector,_true>::get<true>(&scan_chunk.data,__n);
      rcount = scan_chunk.count;
      lcount = left->count;
      pvVar2 = vector<duckdb::JoinCondition,_true>::get<true>(conditions,__n);
      MarkJoinComparisonSwitch(left_00,right_00,lcount,rcount,found_match,pvVar2->comparison);
    }
  }
  DataChunk::~DataChunk(&scan_chunk);
  ColumnDataScanState::~ColumnDataScanState(&scan_state);
  return;
}

Assistant:

void NestedLoopJoinMark::Perform(DataChunk &left, ColumnDataCollection &right, bool found_match[],
                                 const vector<JoinCondition> &conditions) {
	// initialize a new temporary selection vector for the left chunk
	// loop over all chunks in the RHS
	ColumnDataScanState scan_state;
	right.InitializeScan(scan_state);

	DataChunk scan_chunk;
	right.InitializeScanChunk(scan_chunk);

	while (right.Scan(scan_state, scan_chunk)) {
		for (idx_t i = 0; i < conditions.size(); i++) {
			MarkJoinComparisonSwitch(left.data[i], scan_chunk.data[i], left.size(), scan_chunk.size(), found_match,
			                         conditions[i].comparison);
		}
	}
}